

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O3

void __thiscall xray_re::xr_object::load_bones(xr_object *this,xr_reader *r)

{
  uint *puVar1;
  size_t sVar2;
  uint32_t id;
  ulong __n;
  xr_partition *local_50;
  f_r_new<xray_re::xr_bone> local_48;
  xr_bone *local_38;
  
  local_48.pmf = (offset_in_xr_bone_to_subr)xr_bone::load_data;
  local_48._8_8_ = 0;
  local_50 = (xr_partition *)xr_reader::open_chunk(r,0);
  if (local_50 != (xr_partition *)0x0) {
    id = 1;
    do {
      local_38 = (xr_bone *)0x0;
      std::vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>>::
      emplace_back<xray_re::xr_bone*>
                ((vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>> *)&this->m_bones,
                 &local_38);
      xr_reader::f_r_new<xray_re::xr_bone>::operator()
                (&local_48,
                 (this->m_bones).
                 super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl
                 .super__Vector_impl_data._M_finish + -1,(xr_reader *)local_50);
      xr_reader::close_chunk(r,(xr_reader **)&local_50);
      local_50 = (xr_partition *)xr_reader::open_chunk(r,id);
      id = id + 1;
    } while (local_50 != (xr_partition *)0x0);
  }
  sVar2 = xr_reader::find_chunk(r,0x923);
  if (sVar2 != 0) {
    puVar1 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
    __n = (ulong)*puVar1;
    local_48.pmf = (offset_in_xr_bone_to_subr)xr_partition::load_1;
    local_48._8_8_ = 0;
    std::vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>::reserve
              (&this->m_partitions,__n);
    if (__n != 0) {
      do {
        local_50 = (xr_partition *)0x0;
        std::vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>>::
        emplace_back<xray_re::xr_partition*>
                  ((vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>> *)
                   &this->m_partitions,&local_50);
        xr_reader::f_r_new<xray_re::xr_partition>::operator()
                  ((f_r_new<xray_re::xr_partition> *)&local_48,
                   (this->m_partitions).
                   super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1,r);
        __n = __n - 1;
      } while (__n != 0);
    }
  }
  return;
}

Assistant:

void xr_object::load_bones(xr_reader& r)
{
	r.r_chunks(m_bones, xr_reader::f_r_new<xr_bone>(&xr_bone::load_data));
	if (r.find_chunk(EOBJ_CHUNK_PARTITIONS_1)) {
		r.r_seq(r.r_u32(), m_partitions, xr_reader::f_r_new<xr_partition>(&xr_partition::load_1));
		r.debug_find_chunk();
	}
}